

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O1

void __thiscall CMapImages::CMapImages(CMapImages *this)

{
  long lVar1;
  
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CComponent_00214240;
  lVar1 = 0x10;
  do {
    memset((void *)((long)(this->m_Info[0].m_aTextures + -4) + lVar1),0xff,0x100);
    lVar1 = lVar1 + 0x104;
  } while (lVar1 != 0x218);
  this->m_Info[0].m_Count = 0;
  *(undefined8 *)&this->m_Info[1].m_Count = 0xffffffff00000000;
  this->m_EasterIsLoaded = false;
  return;
}

Assistant:

CMapImages::CMapImages()
{
	m_Info[MAP_TYPE_GAME].m_Count = 0;
	m_Info[MAP_TYPE_MENU].m_Count = 0;

	m_EasterIsLoaded = false;
}